

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

bool __thiscall
tst_InsertProxyModel::testCommitSubclass::InsertProxyModelCommit::validColumn
          (InsertProxyModelCommit *this)

{
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  long lVar4;
  long *plVar5;
  QModelIndex local_b0;
  QModelIndex local_98;
  QVariant local_80;
  int local_5c;
  int i;
  int local_3c;
  int sourceRows;
  undefined4 local_1c;
  InsertProxyModelCommit *pIStack_18;
  int sourceCols;
  InsertProxyModelCommit *this_local;
  
  pIStack_18 = this;
  lVar4 = QAbstractProxyModel::sourceModel();
  if (lVar4 != 0) {
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffffc8);
    local_1c = (**(code **)(*plVar5 + 0x80))(plVar5,&stack0xffffffffffffffc8);
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffffa8);
    local_3c = (**(code **)(*plVar5 + 0x78))(plVar5,&stack0xffffffffffffffa8);
    for (local_5c = 0; uVar2 = local_1c, iVar1 = local_5c, local_5c < local_3c;
        local_5c = local_5c + 1) {
      QModelIndex::QModelIndex(&local_b0);
      (**(code **)(*(long *)this + 0x60))(&local_98,this,iVar1,uVar2,&local_b0);
      QModelIndex::data(&local_80,&local_98,0);
      bVar3 = QVariant::isValid(&local_80);
      QVariant::~QVariant(&local_80);
      if (bVar3) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool validColumn() const Q_DECL_OVERRIDE
        {
            if (!sourceModel())
                return false;
            const int sourceCols = sourceModel()->columnCount();
            const int sourceRows = sourceModel()->rowCount();
            for (int i = 0; i < sourceRows; ++i) {
                if (index(i, sourceCols).data().isValid())
                    return true;
            }
            return false;
        }